

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

PIPELINE_RESOURCE_FLAGS Diligent::GetValidPipelineResourceFlags(SHADER_RESOURCE_TYPE ResourceType)

{
  PIPELINE_RESOURCE_FLAGS PVar1;
  string msg;
  string local_28;
  
  if ((byte)(ResourceType - SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) < 8) {
    PVar1 = (PIPELINE_RESOURCE_FLAGS)
            (0x810080d080d0a09 >> ((ResourceType - SHADER_RESOURCE_TYPE_CONSTANT_BUFFER & 7) << 3));
  }
  else {
    FormatString<char[25]>(&local_28,(char (*) [25])"Unexpected resource type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetValidPipelineResourceFlags",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x72b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    PVar1 = PIPELINE_RESOURCE_FLAG_NONE;
  }
  return PVar1;
}

Assistant:

PIPELINE_RESOURCE_FLAGS GetValidPipelineResourceFlags(SHADER_RESOURCE_TYPE ResourceType)
{
    static_assert(SHADER_RESOURCE_TYPE_LAST == 8, "Please update the switch below to handle the new shader resource type");
    switch (ResourceType)
    {
        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_TEXTURE_SRV:
            return PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_BUFFER_SRV:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS | PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_TEXTURE_UAV:
            return PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_BUFFER_UAV:
            return PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS | PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER | PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_SAMPLER:
            return PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT:
            return PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT;

        case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:
            return PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY;

        default:
            UNEXPECTED("Unexpected resource type");
            return PIPELINE_RESOURCE_FLAG_NONE;
    }
}